

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O0

void Js::CrossSite::MarshalDynamicObject(ScriptContext *scriptContext,DynamicObject *object)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  TypeId TVar5;
  uint uVar6;
  undefined4 *puVar7;
  ScriptContext *pSVar8;
  JavascriptLibrary *pJVar9;
  JavascriptFunction *pJVar10;
  HostScriptContext *pHVar11;
  DynamicType *pDVar12;
  JavascriptProxy *this;
  RecyclableObject *aValue;
  JavascriptMethod p_Var13;
  RecyclableObject *target;
  HostScriptContext *hostScriptContext;
  JavascriptFunction *function;
  DynamicObject *object_local;
  ScriptContext *scriptContext_local;
  
  BVar3 = RecyclableObject::IsExternal(&object->super_RecyclableObject);
  if ((BVar3 != 0) ||
     (iVar4 = (*(object->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])(), iVar4 != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x31,"(!object->IsExternal() && !object->IsCrossSiteObject())",
                                "!object->IsExternal() && !object->IsCrossSiteObject()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  (*(object->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x61])(object,scriptContext);
  TVar5 = RecyclableObject::GetTypeId(&object->super_RecyclableObject);
  if (TVar5 == TypeIds_Function) {
    pSVar8 = RecyclableObject::GetScriptContext(&object->super_RecyclableObject);
    pJVar9 = ScriptContext::GetLibrary(pSVar8);
    pJVar10 = JavascriptLibrary::GetDefaultAccessorFunction(pJVar9);
    if ((JavascriptFunction *)object == pJVar10) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                  ,0x38,
                                  "(object != object->GetScriptContext()->GetLibrary()->GetDefaultAccessorFunction())"
                                  ,"default accessor marshalled");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pJVar10 = VarTo<Js::JavascriptFunction,Js::DynamicObject>(object);
    pHVar11 = ScriptContext::GetHostScriptContext(scriptContext);
    if ((pHVar11 == (HostScriptContext *)0x0) ||
       (uVar6 = (*pHVar11->_vptr_HostScriptContext[0x18])(pHVar11,pJVar10), (uVar6 & 1) == 0)) {
      pDVar12 = DynamicObject::GetDynamicType(&pJVar10->super_DynamicObject);
      bVar2 = DynamicType::GetIsLocked(pDVar12);
      if (bVar2) {
        pJVar9 = RecyclableObject::GetLibrary((RecyclableObject *)pJVar10);
        JavascriptLibrary::SetCrossSiteForLockedFunctionType(pJVar9,pJVar10);
      }
      else {
        pSVar8 = RecyclableObject::GetScriptContext((RecyclableObject *)pJVar10);
        JavascriptFunction::SetEntryPoint(pJVar10,pSVar8->CurrentCrossSiteThunk);
      }
    }
  }
  else {
    TVar5 = RecyclableObject::GetTypeId(&object->super_RecyclableObject);
    if (TVar5 == TypeIds_Proxy) {
      this = VarTo<Js::JavascriptProxy,Js::DynamicObject>(object);
      aValue = Js::JavascriptProxy::GetTarget(this);
      bVar2 = JavascriptConversion::IsCallable(aValue);
      if (bVar2) {
        p_Var13 = RecyclableObject::GetEntryPoint(&object->super_RecyclableObject);
        if (p_Var13 != Js::JavascriptProxy::FunctionCallTrap) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                      ,0x54,
                                      "(JavascriptProxy::FunctionCallTrap == object->GetEntryPoint())"
                                      ,
                                      "JavascriptProxy::FunctionCallTrap == object->GetEntryPoint()"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pDVar12 = DynamicObject::GetDynamicType(object);
        DynamicType::SetEntryPoint(pDVar12,CrossSiteProxyCallTrap);
      }
    }
  }
  return;
}

Assistant:

void CrossSite::MarshalDynamicObject(ScriptContext * scriptContext, DynamicObject * object)
    {
        Assert(!object->IsExternal() && !object->IsCrossSiteObject());

        TTD_XSITE_LOG(scriptContext, "MarshalDynamicObject", object);

        object->MarshalToScriptContext(scriptContext);
        if (object->GetTypeId() == TypeIds_Function)
        {
            AssertMsg(object != object->GetScriptContext()->GetLibrary()->GetDefaultAccessorFunction(), "default accessor marshalled");
            JavascriptFunction * function = VarTo<JavascriptFunction>(object);

            //TODO: this may be too aggressive and create x-site thunks that are't technically needed -- see uglify-2js test.

            // See if this function is one that the host needs to handle
            HostScriptContext * hostScriptContext = scriptContext->GetHostScriptContext();
            if (!hostScriptContext || !hostScriptContext->SetCrossSiteForFunctionType(function))
            {
                if (function->GetDynamicType()->GetIsLocked())
                {
                    TTD_XSITE_LOG(scriptContext, "SetCrossSiteForLockedFunctionType ", object);

                    function->GetLibrary()->SetCrossSiteForLockedFunctionType(function);
                }
                else
                {
                    TTD_XSITE_LOG(scriptContext, "setEntryPoint->CurrentCrossSiteThunk ", object);

                    function->SetEntryPoint(function->GetScriptContext()->CurrentCrossSiteThunk);
                }
            }
        }
        else if (object->GetTypeId() == TypeIds_Proxy)
        {
            RecyclableObject * target = VarTo<JavascriptProxy>(object)->GetTarget();
            if (JavascriptConversion::IsCallable(target))
            {
                Assert(JavascriptProxy::FunctionCallTrap == object->GetEntryPoint());
                TTD_XSITE_LOG(scriptContext, "setEntryPoint->CrossSiteProxyCallTrap ", object);
                object->GetDynamicType()->SetEntryPoint(CrossSite::CrossSiteProxyCallTrap);
            }
        }
    }